

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O2

void av1_tpl_preload_rc_estimate(AV1_COMP *cpi,EncodeFrameParams *frame_params)

{
  FRAME_UPDATE_TYPE FVar1;
  AV1_PRIMARY *pAVar2;
  int iVar3;
  ulong uVar4;
  int top_index;
  int bottom_index;
  int local_30;
  int local_2c;
  
  if (cpi->use_ducky_encode != 0) {
    return;
  }
  pAVar2 = cpi->ppi;
  (cpi->common).current_frame.frame_type = frame_params->frame_type;
  for (uVar4 = (ulong)cpi->gf_frame_index; (long)uVar4 < (long)(pAVar2->gf_group).size;
      uVar4 = uVar4 + 1) {
    (cpi->common).current_frame.frame_type = (pAVar2->gf_group).frame_type[uVar4];
    FVar1 = (pAVar2->gf_group).update_type[uVar4];
    (cpi->common).show_frame = (uint)(FVar1 != '\x06' && FVar1 != '\x03');
    iVar3 = av1_rc_pick_q_and_bounds
                      (cpi,(cpi->common).width,(cpi->common).height,(int)uVar4,&local_2c,&local_30);
    (pAVar2->gf_group).q_val[uVar4] = iVar3;
  }
  return;
}

Assistant:

void av1_tpl_preload_rc_estimate(AV1_COMP *cpi,
                                 const EncodeFrameParams *const frame_params) {
  AV1_COMMON *cm = &cpi->common;
  GF_GROUP *gf_group = &cpi->ppi->gf_group;
  int bottom_index, top_index;
  if (cpi->use_ducky_encode) return;

  cm->current_frame.frame_type = frame_params->frame_type;
  for (int gf_index = cpi->gf_frame_index; gf_index < gf_group->size;
       ++gf_index) {
    cm->current_frame.frame_type = gf_group->frame_type[gf_index];
    cm->show_frame = gf_group->update_type[gf_index] != ARF_UPDATE &&
                     gf_group->update_type[gf_index] != INTNL_ARF_UPDATE;
    gf_group->q_val[gf_index] = av1_rc_pick_q_and_bounds(
        cpi, cm->width, cm->height, gf_index, &bottom_index, &top_index);
  }
}